

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::OnThrowExpr(Validator *this,ThrowExpr *expr)

{
  bool bVar1;
  Result result;
  Exception *local_28;
  Exception *except;
  ThrowExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)45>).super_Expr.loc;
  except = (Exception *)expr;
  expr_local = (ThrowExpr *)this;
  result = CheckExceptVar(this,&expr->var,&local_28);
  bVar1 = Succeeded(result);
  if (bVar1) {
    TypeChecker::OnThrow(&this->typechecker_,&local_28->sig);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnThrowExpr(ThrowExpr* expr) {
  expr_loc_ = &expr->loc;
  const Exception* except;
  if (Succeeded(CheckExceptVar(&expr->var, &except))) {
    typechecker_.OnThrow(except->sig);
  }
  return Result::Ok;
}